

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

int __thiscall
Js::FunctionBody::GetEnclosingStatementIndexFromByteCode
          (FunctionBody *this,int byteCodeOffset,bool ignoreSubexpressions)

{
  int iVar1;
  StatementMap *pSVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  undefined4 *puVar6;
  Type *pTVar7;
  int iVar8;
  int local_34;
  
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (this_00 ==
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_34 = -1;
  }
  else {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xc1c,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    iVar8 = (this_00->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    bVar4 = 0 < iVar8;
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        iVar1 = iVar8 + -1;
        if (iVar8 == 0) {
          iVar1 = 0;
        }
        pTVar7 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_00,iVar8);
        pSVar2 = pTVar7->ptr;
        if ((ignoreSubexpressions) && (pSVar2->isSubexpression != false)) {
LAB_0076e5db:
          bVar5 = true;
          if ((pSVar2->isSubexpression == false) && (byteCodeOffset < (pSVar2->byteCodeSpan).begin))
          {
            bVar5 = false;
            local_34 = iVar1;
          }
        }
        else {
          bVar5 = regex::Interval::Includes(&pSVar2->byteCodeSpan,byteCodeOffset);
          if (!bVar5) goto LAB_0076e5db;
          bVar5 = false;
          local_34 = iVar8;
        }
        if (!bVar5) break;
        iVar8 = iVar8 + 1;
        iVar1 = (this_00->
                super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                ).count;
        bVar4 = iVar8 < iVar1;
      } while (iVar8 < iVar1);
    }
    if (!bVar4) {
      local_34 = (this_00->
                 super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                 ).count + -1;
    }
  }
  return local_34;
}

Assistant:

int FunctionBody::GetEnclosingStatementIndexFromByteCode(int byteCodeOffset, bool ignoreSubexpressions /* = false */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps == nullptr)
        {
            // e.g. internal library.
            return -1;
        }

        Assert(m_sourceInfo.pSpanSequence == nullptr);

        for (int index = 0; index < pStatementMaps->Count(); index++)
        {
            FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

            if (!(ignoreSubexpressions && pStatementMap->isSubexpression) && pStatementMap->byteCodeSpan.Includes(byteCodeOffset))
            {
                return index;
            }
            else if (!pStatementMap->isSubexpression && byteCodeOffset < pStatementMap->byteCodeSpan.begin) // We always ignore sub expressions when checking if we went too far
            {
                return index > 0 ? index - 1 : 0;
            }
        }

        return pStatementMaps->Count() - 1;
    }